

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void * myReallocFunc(void *mem,size_t size)

{
  int iVar1;
  void *ret;
  size_t size_local;
  void *mem_local;
  
  mem_local = (void *)xmlMemRealloc(mem,size);
  if ((mem_local != (void *)0x0) && (iVar1 = xmlMemUsed(), maxmem < iVar1)) {
    OOM();
    xmlMemFree(mem_local);
    mem_local = (void *)0x0;
  }
  return mem_local;
}

Assistant:

static void *
myReallocFunc(void *mem, size_t size)
{
    void *ret;

    ret = xmlMemRealloc(mem, size);
    if (ret != NULL) {
        if (xmlMemUsed() > maxmem) {
            OOM();
            xmlMemFree(ret);
            return (NULL);
        }
    }
    return (ret);
}